

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O1

base_uint<128UL,_void> __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STBitString<128ul>,jbcoin::base_uint<128ul,void>>
          (STObject *this,SField *field)

{
  int iVar1;
  _func_int **pp_Var2;
  SField *pSVar3;
  STBase *pSVar4;
  base_uint<128UL,_void> bVar5;
  
  iVar1 = getFieldIndex(this,field);
  if (iVar1 == -1) {
    pSVar4 = (STBase *)0x0;
  }
  else {
    pSVar4 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar1].p_;
  }
  if (pSVar4 != (STBase *)0x0) {
    iVar1 = (*pSVar4->_vptr_STBase[4])(pSVar4);
    if (iVar1 == 0) {
      pp_Var2 = (_func_int **)0x0;
      pSVar3 = (SField *)0x0;
    }
    else {
      if (pSVar4->_vptr_STBase != (_func_int **)&PTR__STBase_002d84d0) {
        Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
      }
      pp_Var2 = pSVar4[1]._vptr_STBase;
      pSVar3 = pSVar4[1].fName;
    }
    bVar5.pn._8_8_ = pSVar3;
    bVar5.pn._0_8_ = pp_Var2;
    return (base_uint<128UL,_void>)bVar5.pn;
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }